

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bac.h
# Opt level: O1

int Bac_BoxBoNum(Bac_Ntk_t *p,int i)

{
  int iVar1;
  char *pcVar2;
  int iVar3;
  int iVar4;
  byte *pbVar5;
  
  if ((i < 0) || (iVar1 = (p->vType).nSize, iVar1 <= i)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecStr.h"
                  ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
  }
  pcVar2 = (p->vType).pArray;
  if (((byte)pcVar2[(uint)i] >> 1) - 0x49 < 0xffffffbc) {
    __assert_fail("Bac_ObjIsBox(p, i)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/bac/bac.h"
                  ,0x131,"int Bac_BoxBoNum(Bac_Ntk_t *, int)");
  }
  iVar3 = i + -1;
  pbVar5 = (byte *)(pcVar2 + (uint)i);
  do {
    pbVar5 = pbVar5 + 1;
    iVar4 = iVar1 + -1;
    if (iVar1 <= iVar3 + 2) break;
    iVar3 = iVar3 + 1;
    iVar4 = iVar3;
  } while ((*pbVar5 & 0xfe) == 8);
  return iVar4 - i;
}

Assistant:

static inline int            Bac_BoxBoNum( Bac_Ntk_t * p, int i )            { int s = i+1; assert(Bac_ObjIsBox(p, i)); while (++i < Bac_NtkObjNum(p) && Bac_ObjIsBo(p, i)) {} return i - s;  }